

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O1

void __thiscall
CAMFImporter_NodeElement_TexMap::CAMFImporter_NodeElement_TexMap
          (CAMFImporter_NodeElement_TexMap *this,CAMFImporter_NodeElement *pParent)

{
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar1;
  
  (this->super_CAMFImporter_NodeElement).Type = ENET_TexMap;
  (this->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p =
       (pointer)&(this->super_CAMFImporter_NodeElement).ID.field_2;
  (this->super_CAMFImporter_NodeElement).ID._M_string_length = 0;
  (this->super_CAMFImporter_NodeElement).ID.field_2._M_local_buf[0] = '\0';
  (this->super_CAMFImporter_NodeElement).Parent = pParent;
  plVar1 = &(this->super_CAMFImporter_NodeElement).Child;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_TexMap_00897eb0;
  this->TextureCoordinate[0].x = 0.0;
  this->TextureCoordinate[0].y = 0.0;
  *(undefined8 *)&this->TextureCoordinate[0].z = 0;
  this->TextureCoordinate[1].y = 0.0;
  this->TextureCoordinate[1].z = 0.0;
  this->TextureCoordinate[2].x = 0.0;
  this->TextureCoordinate[2].y = 0.0;
  this->TextureCoordinate[2].z = 0.0;
  (this->TextureID_R)._M_dataplus._M_p = (pointer)&(this->TextureID_R).field_2;
  (this->TextureID_R)._M_string_length = 0;
  (this->TextureID_R).field_2._M_local_buf[0] = '\0';
  (this->TextureID_G)._M_dataplus._M_p = (pointer)&(this->TextureID_G).field_2;
  (this->TextureID_G)._M_string_length = 0;
  (this->TextureID_G).field_2._M_local_buf[0] = '\0';
  (this->TextureID_B)._M_dataplus._M_p = (pointer)&(this->TextureID_B).field_2;
  (this->TextureID_B)._M_string_length = 0;
  (this->TextureID_B).field_2._M_local_buf[0] = '\0';
  (this->TextureID_A)._M_dataplus._M_p = (pointer)&(this->TextureID_A).field_2;
  (this->TextureID_A)._M_string_length = 0;
  (this->TextureID_A).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

CAMFImporter_NodeElement(const EType pType, CAMFImporter_NodeElement* pParent)
	: Type(pType)
    , ID()
    , Parent(pParent)
    , Child() {
        // empty
    }